

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O1

void __thiscall spatial_region::~spatial_region(spatial_region *this)

{
  pwpa *ppVar1;
  pointer pdVar2;
  cellp *pcVar3;
  cellp **ppcVar4;
  cellp ***pppcVar5;
  cellbe *pcVar6;
  cellbe **ppcVar7;
  cellbe ***pppcVar8;
  cellj *pcVar9;
  cellj **ppcVar10;
  cellj ***pppcVar11;
  cellb *pcVar12;
  cellb **ppcVar13;
  cellb ***pppcVar14;
  celle *pcVar15;
  celle **ppcVar16;
  celle ***pppcVar17;
  pointer pcVar18;
  _Manager_type p_Var19;
  maxwell_solver *pmVar20;
  pwpo *a;
  pwpo *ppVar21;
  
  ppVar21 = this->p_lapwpo;
  while (ppVar21 != (pwpo *)0x0) {
    this->p_lapwpo = ppVar21->previous;
    free(ppVar21->head);
    operator_delete(ppVar21);
    ppVar21 = this->p_lapwpo;
  }
  while (ppVar1 = this->p_lapwpa, ppVar1 != (pwpa *)0x0) {
    this->p_lapwpa = ppVar1->previous;
    free(ppVar1->head);
    operator_delete(ppVar1);
  }
  free(this->random);
  free(this->ienergy);
  free(this->ienergy_deleted);
  free(this->N_qp_i);
  pdVar2 = (this->deleted_particles).
           super__Vector_base<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector(&this->irho);
  pcVar3 = (this->cp).p3._M_t.super___uniq_ptr_impl<cellp,_std::default_delete<cellp[]>_>._M_t.
           super__Tuple_impl<0UL,_cellp_*,_std::default_delete<cellp[]>_>.
           super__Head_base<0UL,_cellp_*,_false>._M_head_impl;
  if (pcVar3 != (cellp *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->cp).p3._M_t.super___uniq_ptr_impl<cellp,_std::default_delete<cellp[]>_>._M_t.
  super__Tuple_impl<0UL,_cellp_*,_std::default_delete<cellp[]>_>.
  super__Head_base<0UL,_cellp_*,_false>._M_head_impl = (cellp *)0x0;
  ppcVar4 = (this->cp).p2._M_t.super___uniq_ptr_impl<cellp_*,_std::default_delete<cellp_*[]>_>._M_t.
            super__Tuple_impl<0UL,_cellp_**,_std::default_delete<cellp_*[]>_>.
            super__Head_base<0UL,_cellp_**,_false>._M_head_impl;
  if (ppcVar4 != (cellp **)0x0) {
    operator_delete__(ppcVar4);
  }
  (this->cp).p2._M_t.super___uniq_ptr_impl<cellp_*,_std::default_delete<cellp_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellp_**,_std::default_delete<cellp_*[]>_>.
  super__Head_base<0UL,_cellp_**,_false>._M_head_impl = (cellp **)0x0;
  pppcVar5 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
             _M_t.super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
             super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
  if (pppcVar5 != (cellp ***)0x0) {
    operator_delete__(pppcVar5);
  }
  (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
  super__Head_base<0UL,_cellp_***,_false>._M_head_impl = (cellp ***)0x0;
  pcVar6 = (this->cbe).p3._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
           super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
           super__Head_base<0UL,_cellbe_*,_false>._M_head_impl;
  if (pcVar6 != (cellbe *)0x0) {
    operator_delete__(pcVar6);
  }
  (this->cbe).p3._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
  super__Head_base<0UL,_cellbe_*,_false>._M_head_impl = (cellbe *)0x0;
  ppcVar7 = (this->cbe).p2._M_t.super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>.
            _M_t.super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
            super__Head_base<0UL,_cellbe_**,_false>._M_head_impl;
  if (ppcVar7 != (cellbe **)0x0) {
    operator_delete__(ppcVar7);
  }
  (this->cbe).p2._M_t.super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
  super__Head_base<0UL,_cellbe_**,_false>._M_head_impl = (cellbe **)0x0;
  pppcVar8 = (this->cbe).p._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>.
             _M_t.super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
             super__Head_base<0UL,_cellbe_***,_false>._M_head_impl;
  if (pppcVar8 != (cellbe ***)0x0) {
    operator_delete__(pppcVar8);
  }
  (this->cbe).p._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl = (cellbe ***)0x0;
  pcVar9 = (this->cj).p3._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
           super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
           super__Head_base<0UL,_cellj_*,_false>._M_head_impl;
  if (pcVar9 != (cellj *)0x0) {
    operator_delete__(pcVar9);
  }
  (this->cj).p3._M_t.super___uniq_ptr_impl<cellj,_std::default_delete<cellj[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_*,_std::default_delete<cellj[]>_>.
  super__Head_base<0UL,_cellj_*,_false>._M_head_impl = (cellj *)0x0;
  ppcVar10 = (this->cj).p2._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>._M_t
             .super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
             super__Head_base<0UL,_cellj_**,_false>._M_head_impl;
  if (ppcVar10 != (cellj **)0x0) {
    operator_delete__(ppcVar10);
  }
  (this->cj).p2._M_t.super___uniq_ptr_impl<cellj_*,_std::default_delete<cellj_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_**,_std::default_delete<cellj_*[]>_>.
  super__Head_base<0UL,_cellj_**,_false>._M_head_impl = (cellj **)0x0;
  pppcVar11 = (this->cj).p._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>.
              _M_t.super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
              super__Head_base<0UL,_cellj_***,_false>._M_head_impl;
  if (pppcVar11 != (cellj ***)0x0) {
    operator_delete__(pppcVar11);
  }
  (this->cj).p._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
  super__Head_base<0UL,_cellj_***,_false>._M_head_impl = (cellj ***)0x0;
  pcVar12 = (this->cb).p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
            super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
            super__Head_base<0UL,_cellb_*,_false>._M_head_impl;
  if (pcVar12 != (cellb *)0x0) {
    operator_delete__(pcVar12);
  }
  (this->cb).p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl = (cellb *)0x0;
  ppcVar13 = (this->cb).p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t
             .super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
             super__Head_base<0UL,_cellb_**,_false>._M_head_impl;
  if (ppcVar13 != (cellb **)0x0) {
    operator_delete__(ppcVar13);
  }
  (this->cb).p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl = (cellb **)0x0;
  pppcVar14 = (this->cb).p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>.
              _M_t.super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
              super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
  if (pppcVar14 != (cellb ***)0x0) {
    operator_delete__(pppcVar14);
  }
  (this->cb).p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl = (cellb ***)0x0;
  pcVar15 = (this->ce).p3._M_t.super___uniq_ptr_impl<celle,_std::default_delete<celle[]>_>._M_t.
            super__Tuple_impl<0UL,_celle_*,_std::default_delete<celle[]>_>.
            super__Head_base<0UL,_celle_*,_false>._M_head_impl;
  if (pcVar15 != (celle *)0x0) {
    operator_delete__(pcVar15);
  }
  (this->ce).p3._M_t.super___uniq_ptr_impl<celle,_std::default_delete<celle[]>_>._M_t.
  super__Tuple_impl<0UL,_celle_*,_std::default_delete<celle[]>_>.
  super__Head_base<0UL,_celle_*,_false>._M_head_impl = (celle *)0x0;
  ppcVar16 = (this->ce).p2._M_t.super___uniq_ptr_impl<celle_*,_std::default_delete<celle_*[]>_>._M_t
             .super__Tuple_impl<0UL,_celle_**,_std::default_delete<celle_*[]>_>.
             super__Head_base<0UL,_celle_**,_false>._M_head_impl;
  if (ppcVar16 != (celle **)0x0) {
    operator_delete__(ppcVar16);
  }
  (this->ce).p2._M_t.super___uniq_ptr_impl<celle_*,_std::default_delete<celle_*[]>_>._M_t.
  super__Tuple_impl<0UL,_celle_**,_std::default_delete<celle_*[]>_>.
  super__Head_base<0UL,_celle_**,_false>._M_head_impl = (celle **)0x0;
  pppcVar17 = (this->ce).p._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>.
              _M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
              super__Head_base<0UL,_celle_***,_false>._M_head_impl;
  if (pppcVar17 != (celle ***)0x0) {
    operator_delete__(pppcVar17);
  }
  (this->ce).p._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
  super__Head_base<0UL,_celle_***,_false>._M_head_impl = (celle ***)0x0;
  pcVar18 = (this->data_folder)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar18 != &(this->data_folder).field_2) {
    operator_delete(pcVar18);
  }
  p_Var19 = (this->advance_momentum).super__Function_base._M_manager;
  if (p_Var19 != (_Manager_type)0x0) {
    (*p_Var19)((_Any_data *)&this->advance_momentum,(_Any_data *)&this->advance_momentum,
               __destroy_functor);
  }
  pmVar20 = (this->solver)._M_t.
            super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>._M_t.
            super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
            super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl;
  if (pmVar20 != (maxwell_solver *)0x0) {
    (*pmVar20->_vptr_maxwell_solver[7])();
  }
  (this->solver)._M_t.super___uniq_ptr_impl<maxwell_solver,_std::default_delete<maxwell_solver>_>.
  _M_t.super__Tuple_impl<0UL,_maxwell_solver_*,_std::default_delete<maxwell_solver>_>.
  super__Head_base<0UL,_maxwell_solver_*,_false>._M_head_impl = (maxwell_solver *)0x0;
  return;
}

Assistant:

spatial_region::~spatial_region()
{
    // erasing of particles
    while (p_lapwpo!=0) {
        pwpo* a;
        a = p_lapwpo;
        p_lapwpo = p_lapwpo->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }
    while (p_lapwpa!=0) {
        pwpa* a;
        a = p_lapwpa;
        p_lapwpa = p_lapwpa->previous;
        free((void*) a->head);
        //free(a->head);
        delete a;
    }

    void* pv;

    pv = (void*) random;
    free(pv);

    pv = (void*) ienergy;
    free(pv);
    pv = (void*) ienergy_deleted;
    free(pv);

    pv = (void*) N_qp_i;
    free(pv);
}